

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_init(Curl_easy *data)

{
  FILEPROTO *pFVar1;
  POP3 *pop3;
  CURLcode result;
  Curl_easy *data_local;
  
  pop3._4_4_ = CURLE_OK;
  pFVar1 = (FILEPROTO *)(*Curl_ccalloc)(1,0x18);
  (data->req).p.file = pFVar1;
  if (pFVar1 == (FILEPROTO *)0x0) {
    pop3._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return pop3._4_4_;
}

Assistant:

static CURLcode pop3_init(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct POP3 *pop3;

  pop3 = data->req.p.pop3 = calloc(1, sizeof(struct POP3));
  if(!pop3)
    result = CURLE_OUT_OF_MEMORY;

  return result;
}